

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qc_socket.c
# Opt level: O2

int qc_tcp_bind(QcSocket *socket,char *ip,int port)

{
  int iVar1;
  int iVar2;
  sockaddr local_30;
  
  if (socket == (QcSocket *)0x0) {
    fprintf(_stderr,"stderr: assert throw. [%s  line:%d]\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_rt/qc_socket.c"
            ,0x7f);
    __assert_fail("socket",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_rt/qc_socket.c"
                  ,0x7f,"int qc_tcp_bind(QcSocket *, const char *, int)");
  }
  if (ip != (char *)0x0) {
    if (0 < port) {
      local_30.sa_family = 2;
      local_30.sa_data._0_2_ = (ushort)port << 8 | (ushort)port >> 8;
      iVar1 = strcmp(ip,"127.0.0.1");
      iVar2 = 0;
      local_30.sa_data._2_4_ = 0;
      if (iVar1 != 0) {
        local_30.sa_data._2_4_ = inet_addr(ip);
      }
      iVar1 = bind(socket->sockfd,&local_30,0x10);
      if (iVar1 != 0) {
        _qc_perror("/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_rt/qc_socket.c"
                   ,0x8d,"socket bind failed (ip=%s port=%d)",ip,(ulong)(uint)port);
        iVar2 = -1;
      }
      return iVar2;
    }
    fprintf(_stderr,"stderr: assert throw. [%s  line:%d]\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_rt/qc_socket.c"
            ,0x81);
    __assert_fail("port>0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_rt/qc_socket.c"
                  ,0x81,"int qc_tcp_bind(QcSocket *, const char *, int)");
  }
  fprintf(_stderr,"stderr: assert throw. [%s  line:%d]\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_rt/qc_socket.c"
          ,0x80);
  __assert_fail("ip",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_rt/qc_socket.c"
                ,0x80,"int qc_tcp_bind(QcSocket *, const char *, int)");
}

Assistant:

int qc_tcp_bind(QcSocket *socket, const char* ip, int port)
{
    struct sockaddr_in servaddr;

    qc_assert(socket);
    qc_assert(ip);
    qc_assert(port>0);

    servaddr.sin_family = AF_INET;
    servaddr.sin_port = htons(port);

    if(NULL == ip || (0 == strcmp(ip, "127.0.0.1")))
        servaddr.sin_addr.s_addr = htonl(INADDR_ANY);
    else
        servaddr.sin_addr.s_addr = inet_addr(ip);

    if(0 != bind(socket->sockfd, (struct sockaddr*)&servaddr, sizeof(servaddr)))
    {
        qc_perror("socket bind failed (ip=%s port=%d)", ip, port);
        return -1;
    }

    return 0;
}